

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O2

int LZ4_compress_fast_extState_fastReset
              (void *state,char *src,char *dst,int srcSize,int dstCapacity,int acceleration)

{
  ulong *puVar1;
  ushort uVar2;
  short sVar3;
  char cVar4;
  BYTE *d;
  long *plVar5;
  char *pcVar6;
  long lVar7;
  short *psVar8;
  char *pcVar9;
  int iVar10;
  uint uVar11;
  ulong *puVar12;
  uint uVar13;
  int iVar14;
  int *piVar15;
  BYTE *e_5;
  long lVar16;
  ulong uVar17;
  char cVar18;
  int iVar19;
  ulong *puVar20;
  long lVar21;
  uint uVar22;
  long lVar23;
  int *piVar24;
  ulong uVar25;
  ulong uVar26;
  short *psVar27;
  BYTE *e_1;
  long *plVar28;
  long *plVar29;
  int *piVar30;
  int *piVar31;
  char *pcVar32;
  BYTE *e;
  long *plVar33;
  short *psVar34;
  short *local_88;
  U16 *hashTable;
  int local_60;
  
  if (acceleration < 2) {
    acceleration = 1;
  }
  if (0x10000 < acceleration) {
    acceleration = 0x10001;
  }
  iVar10 = 0;
  if ((uint)srcSize < 0x7e000001) {
    iVar10 = srcSize + (uint)srcSize / 0xff + 0x10;
  }
  iVar14 = *(int *)((long)state + 0x4004);
  local_60 = (int)dst;
  sVar3 = (short)src;
  if (iVar10 <= dstCapacity) {
    if (0x1000a < srcSize) {
      if (iVar14 == 0) {
        if (*(int *)((long)state + 0x4000) == 0) {
          uVar22 = 0;
        }
        else {
          uVar22 = *(int *)((long)state + 0x4000) + 0x10000;
          *(uint *)((long)state + 0x4000) = uVar22;
        }
      }
      else {
        uVar22 = 0;
        memset(state,0,0x4008);
      }
      *(undefined4 *)((long)state + 0x4018) = 0;
      *(undefined8 *)((long)state + 0x4008) = 0;
      *(undefined8 *)((long)state + 0x4010) = 0;
      if (0x7e000000 < (uint)srcSize) {
        return 0;
      }
      lVar21 = (long)src - (ulong)uVar22;
      *(int *)((long)state + 0x4018) = srcSize;
      *(uint *)((long)state + 0x4000) = srcSize + uVar22;
      *(undefined4 *)((long)state + 0x4004) = 2;
      *(uint *)((long)state + ((ulong)(*(long *)src * -0x30e4432345000000) >> 0x34) * 4) = uVar22;
      plVar29 = (long *)src;
LAB_0013ba33:
      lVar23 = *(long *)((long)plVar29 + 1);
      uVar25 = 1;
      plVar5 = (long *)((long)plVar29 + 1);
      uVar22 = acceleration << 6;
      while( true ) {
        plVar28 = (long *)(uVar25 + (long)plVar5);
        pcVar9 = dst;
        if (src + ((ulong)(uint)srcSize - 0xb) < plVar28) goto LAB_0013bce7;
        uVar25 = (ulong)(lVar23 * -0x30e4432345000000) >> 0x34;
        uVar13 = *(uint *)((long)state + uVar25 * 4);
        iVar10 = (int)plVar5;
        iVar14 = (int)lVar21;
        lVar23 = *plVar28;
        *(int *)((long)state + uVar25 * 4) = iVar10 - iVar14;
        if (((uint)(iVar10 - iVar14) <= uVar13 + 0xffff) &&
           (*(int *)(lVar21 + (ulong)uVar13) == (int)*plVar5)) break;
        uVar25 = (ulong)(uVar22 >> 6);
        uVar22 = uVar22 + 1;
        plVar5 = plVar28;
      }
      lVar7 = (ulong)uVar13 + lVar21;
      iVar19 = (int)plVar29;
      lVar23 = 0;
      cVar4 = (char)plVar5 * '\x10' + (char)plVar29 * -0x10;
      do {
        cVar18 = cVar4;
        lVar16 = lVar23;
        piVar31 = (int *)(lVar7 + lVar16);
        plVar28 = (long *)((long)plVar5 + lVar16);
        if ((piVar31 <= src) || (plVar28 <= plVar29)) break;
        lVar23 = lVar16 + -1;
        cVar4 = cVar18 + -0x10;
      } while (*(char *)((long)plVar5 + lVar16 + -1) == *(char *)(lVar7 + -1 + lVar16));
      if ((uint)((iVar10 - iVar19) + (int)lVar16) < 0xf) {
        plVar5 = (long *)(dst + 1);
        *dst = cVar18;
      }
      else {
        *dst = -0x10;
        plVar5 = (long *)(dst + 2);
        for (iVar10 = (iVar10 - iVar19) + (int)lVar16 + -0xf; 0xfe < iVar10; iVar10 = iVar10 + -0xff
            ) {
          *(char *)((long)plVar5 + -1) = -1;
          plVar5 = (long *)((long)plVar5 + 1);
        }
        *(char *)((long)plVar5 + -1) = (char)iVar10;
      }
      plVar33 = (long *)((ulong)(uint)((int)plVar28 - iVar19) + (long)plVar5);
      do {
        *plVar5 = *plVar29;
        plVar5 = plVar5 + 1;
        plVar29 = plVar29 + 1;
      } while (plVar5 < plVar33);
      do {
        *(short *)plVar33 = (short)plVar28 - (short)piVar31;
        pcVar9 = (char *)((long)plVar33 + 2);
        puVar1 = (ulong *)((long)plVar28 + 4);
        puVar12 = (ulong *)(piVar31 + 1);
        puVar20 = puVar1;
        if (puVar1 < src + ((ulong)(uint)srcSize - 0xc)) {
          if (*puVar12 == *puVar1) {
            puVar12 = (ulong *)(piVar31 + 3);
            puVar20 = (ulong *)((long)plVar28 + 0xc);
            goto LAB_0013bbcc;
          }
          uVar26 = *puVar1 ^ *puVar12;
          uVar25 = 0;
          if (uVar26 != 0) {
            for (; (uVar26 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
            }
          }
          uVar25 = uVar25 >> 3 & 0x1fffffff;
          plVar29 = (long *)((long)plVar28 + uVar25 + 4);
LAB_0013bc43:
          *dst = *dst + (char)uVar25;
        }
        else {
LAB_0013bbcc:
          if (puVar20 < src + ((ulong)(uint)srcSize - 0xc)) {
            if (*puVar12 == *puVar20) goto code_r0x0013bbdc;
            uVar26 = *puVar20 ^ *puVar12;
            uVar25 = 0;
            if (uVar26 != 0) {
              for (; (uVar26 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
              }
            }
            puVar20 = (ulong *)((long)puVar20 + (uVar25 >> 3 & 0x1fffffff));
          }
          else {
            if ((puVar20 < src + ((ulong)(uint)srcSize - 8)) && ((int)*puVar12 == (int)*puVar20)) {
              puVar20 = (ulong *)((long)puVar20 + 4);
              puVar12 = (ulong *)((long)puVar12 + 4);
            }
            if ((puVar20 < src + ((ulong)(uint)srcSize - 6)) && ((short)*puVar12 == (short)*puVar20)
               ) {
              puVar20 = (ulong *)((long)puVar20 + 2);
              puVar12 = (ulong *)((long)puVar12 + 2);
            }
            if (puVar20 < src + ((ulong)(uint)srcSize - 5)) {
              puVar20 = (ulong *)((long)puVar20 + (ulong)((char)*puVar12 == (char)*puVar20));
            }
          }
          uVar25 = (long)puVar20 - (long)puVar1;
          plVar29 = (long *)((long)plVar28 + (uVar25 & 0xffffffff) + 4);
          if ((uint)uVar25 < 0xf) goto LAB_0013bc43;
          *dst = *dst + '\x0f';
          pcVar9[0] = -1;
          pcVar9[1] = -1;
          pcVar9[2] = -1;
          pcVar9[3] = -1;
          lVar23 = 0;
          for (uVar22 = (uint)uVar25 - 0xf; 0x3fb < uVar22; uVar22 = uVar22 - 0x3fc) {
            pcVar9 = (char *)((long)plVar33 + lVar23 + 6);
            pcVar9[0] = -1;
            pcVar9[1] = -1;
            pcVar9[2] = -1;
            pcVar9[3] = -1;
            lVar23 = lVar23 + 4;
          }
          lVar7 = lVar23 + (ulong)(uVar22 & 0xffff) / 0xff;
          pcVar9 = (char *)((long)plVar33 + lVar7 + 3);
          *(char *)((long)plVar33 + lVar7 + 2) =
               (char)lVar23 +
               (char)((ushort)uVar22 / 0xff) + ((char)puVar20 - (char)plVar28) + -0x13;
        }
        if (src + ((ulong)(uint)srcSize - 0xb) <= plVar29) goto LAB_0013bce7;
        *(int *)((long)state +
                ((ulong)(*(long *)((long)plVar29 + -2) * -0x30e4432345000000) >> 0x34) * 4) =
             ((int)plVar29 + -2) - iVar14;
        uVar25 = (ulong)(*plVar29 * -0x30e4432345000000) >> 0x34;
        uVar13 = (int)plVar29 - iVar14;
        uVar22 = *(uint *)((long)state + uVar25 * 4);
        piVar31 = (int *)((ulong)uVar22 + lVar21);
        *(uint *)((long)state + uVar25 * 4) = uVar13;
        dst = pcVar9;
        if ((uVar22 + 0xffff < uVar13) || (*piVar31 != (int)*plVar29)) goto LAB_0013ba33;
        plVar33 = (long *)(pcVar9 + 1);
        *pcVar9 = '\0';
        plVar28 = plVar29;
      } while( true );
    }
    if (iVar14 == 3) {
      uVar22 = *(uint *)((long)state + 0x4000);
      if (0xfff < srcSize || 0xfffe < srcSize + uVar22) goto LAB_0013b46a;
    }
    else if (iVar14 == 0) {
      uVar22 = *(uint *)((long)state + 0x4000);
    }
    else {
LAB_0013b46a:
      uVar22 = 0;
      memset(state,0,0x4008);
    }
    *(undefined4 *)((long)state + 0x4018) = 0;
    *(undefined8 *)((long)state + 0x4008) = 0;
    *(undefined8 *)((long)state + 0x4010) = 0;
    if (uVar22 == 0) {
      if (0x7e000000 < (uint)srcSize) {
        return 0;
      }
      if (srcSize != 0) {
        *(int *)((long)state + 0x4018) = srcSize;
        *(int *)((long)state + 0x4000) = srcSize;
        *(undefined4 *)((long)state + 0x4004) = 3;
        piVar31 = (int *)src;
        if (0xc < (uint)srcSize) {
          *(undefined2 *)((long)state + (ulong)((uint)(*(int *)src * -0x61c8864f) >> 0x13) * 2) = 0;
          psVar8 = (short *)dst;
LAB_0013c80d:
          uVar25 = 1;
          iVar10 = *(int *)((long)piVar31 + 1);
          piVar15 = (int *)((long)piVar31 + 1);
          uVar22 = acceleration << 6;
          do {
            piVar24 = piVar15;
            piVar15 = (int *)(uVar25 + (long)piVar24);
            dst = (char *)psVar8;
            if (src + ((ulong)(uint)srcSize - 0xb) < piVar15) goto LAB_0013cac0;
            uVar25 = (ulong)(uVar22 >> 6);
            uVar22 = uVar22 + 1;
            uVar17 = (ulong)((uint)(iVar10 * -0x61c8864f) >> 0x13);
            uVar26 = (ulong)*(ushort *)((long)state + uVar17 * 2);
            iVar10 = *piVar15;
            *(short *)((long)state + uVar17 * 2) = (short)piVar24 - sVar3;
          } while (*(int *)(src + uVar26) != *piVar24);
          iVar10 = (int)piVar31;
          lVar21 = 0;
          cVar4 = (char)piVar24 * '\x10' + (char)piVar31 * -0x10;
          do {
            cVar18 = cVar4;
            lVar23 = lVar21;
            pcVar9 = src + lVar23 + uVar26;
            piVar15 = (int *)((long)piVar24 + lVar23);
            if ((pcVar9 <= src) || (piVar15 <= piVar31)) break;
            lVar21 = lVar23 + -1;
            cVar4 = cVar18 + -0x10;
          } while (*(char *)((long)piVar24 + lVar23 + -1) == src[lVar23 + (uVar26 - 1)]);
          if ((uint)(((int)piVar24 - iVar10) + (int)lVar23) < 0xf) {
            psVar34 = (short *)((long)psVar8 + 1);
            *(char *)psVar8 = cVar18;
          }
          else {
            *(char *)psVar8 = -0x10;
            psVar34 = psVar8 + 1;
            for (iVar14 = ((int)piVar24 - iVar10) + (int)lVar23 + -0xf; 0xfe < iVar14;
                iVar14 = iVar14 + -0xff) {
              *(char *)((long)psVar34 + -1) = -1;
              psVar34 = (short *)((long)psVar34 + 1);
            }
            *(char *)((long)psVar34 + -1) = (char)iVar14;
          }
          psVar27 = (short *)((ulong)(uint)((int)piVar15 - iVar10) + (long)psVar34);
          do {
            *(undefined8 *)psVar34 = *(undefined8 *)piVar31;
            psVar34 = psVar34 + 4;
            piVar31 = piVar31 + 2;
          } while (psVar34 < psVar27);
          do {
            *psVar27 = (short)piVar15 - (short)pcVar9;
            dst = (char *)(psVar27 + 1);
            puVar1 = (ulong *)(piVar15 + 1);
            puVar12 = (ulong *)(pcVar9 + 4);
            puVar20 = puVar1;
            if (puVar1 < src + ((ulong)(uint)srcSize - 0xc)) {
              if (*puVar12 == *puVar1) {
                puVar12 = (ulong *)(pcVar9 + 0xc);
                puVar20 = (ulong *)(piVar15 + 3);
                goto LAB_0013c9af;
              }
              uVar26 = *puVar1 ^ *puVar12;
              uVar25 = 0;
              if (uVar26 != 0) {
                for (; (uVar26 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                }
              }
              uVar25 = uVar25 >> 3 & 0x1fffffff;
              piVar31 = (int *)((long)piVar15 + uVar25 + 4);
LAB_0013ca2a:
              *(char *)psVar8 = (char)*psVar8 + (char)uVar25;
            }
            else {
LAB_0013c9af:
              if (puVar20 < src + ((ulong)(uint)srcSize - 0xc)) {
                if (*puVar12 == *puVar20) goto code_r0x0013c9c3;
                uVar26 = *puVar20 ^ *puVar12;
                uVar25 = 0;
                if (uVar26 != 0) {
                  for (; (uVar26 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                  }
                }
                puVar20 = (ulong *)((long)puVar20 + (uVar25 >> 3 & 0x1fffffff));
              }
              else {
                if ((puVar20 < src + ((ulong)(uint)srcSize - 8)) && ((int)*puVar12 == (int)*puVar20)
                   ) {
                  puVar20 = (ulong *)((long)puVar20 + 4);
                  puVar12 = (ulong *)((long)puVar12 + 4);
                }
                if ((puVar20 < src + ((ulong)(uint)srcSize - 6)) &&
                   ((short)*puVar12 == (short)*puVar20)) {
                  puVar20 = (ulong *)((long)puVar20 + 2);
                  puVar12 = (ulong *)((long)puVar12 + 2);
                }
                if (puVar20 < src + ((ulong)(uint)srcSize - 5)) {
                  puVar20 = (ulong *)((long)puVar20 + (ulong)((char)*puVar12 == (char)*puVar20));
                }
              }
              uVar25 = (long)puVar20 - (long)puVar1;
              piVar31 = (int *)((long)piVar15 + (uVar25 & 0xffffffff) + 4);
              if ((uint)uVar25 < 0xf) goto LAB_0013ca2a;
              *(char *)psVar8 = (char)*psVar8 + '\x0f';
              *(short *)((long)dst + 0) = -1;
              *(short *)((long)dst + 2) = -1;
              lVar21 = 0;
              for (uVar22 = (uint)uVar25 - 0xf; 0x3fb < uVar22; uVar22 = uVar22 - 0x3fc) {
                pcVar9 = (char *)((long)psVar27 + lVar21 + 6);
                pcVar9[0] = -1;
                pcVar9[1] = -1;
                pcVar9[2] = -1;
                pcVar9[3] = -1;
                lVar21 = lVar21 + 4;
              }
              lVar23 = lVar21 + (ulong)(uVar22 & 0xffff) / 0xff;
              dst = (char *)((long)psVar27 + lVar23 + 3);
              *(char *)((long)psVar27 + lVar23 + 2) =
                   (char)lVar21 +
                   (char)((ushort)uVar22 / 0xff) + ((char)puVar20 - (char)piVar15) + -0x13;
            }
            if (src + ((ulong)(uint)srcSize - 0xb) <= piVar31) break;
            *(short *)((long)state +
                      (ulong)((uint)(*(int *)((long)piVar31 + -2) * -0x61c8864f) >> 0x13) * 2) =
                 ((short)piVar31 + -2) - sVar3;
            uVar25 = (ulong)((uint)(*piVar31 * -0x61c8864f) >> 0x13);
            uVar2 = *(ushort *)((long)state + uVar25 * 2);
            pcVar9 = src + uVar2;
            *(short *)((long)state + uVar25 * 2) = (short)piVar31 - sVar3;
            psVar8 = (short *)dst;
            if (*(int *)(src + uVar2) != *piVar31) goto LAB_0013c80d;
            psVar27 = (short *)((long)dst + 1);
            *dst = '\0';
            piVar15 = piVar31;
          } while( true );
        }
LAB_0013cac0:
        pcVar9 = src + ((ulong)(uint)srcSize - (long)piVar31);
        if (pcVar9 < (char *)0xf) {
          *dst = (char)pcVar9 << 4;
        }
        else {
          *dst = -0x10;
          for (pcVar32 = pcVar9 + -0xf; dst = (char *)((long)dst + 1), (char *)0xfe < pcVar32;
              pcVar32 = pcVar32 + -0xff) {
            *dst = -1;
          }
          *dst = (char)pcVar32;
        }
        memcpy((char *)((long)dst + 1),piVar31,(size_t)pcVar9);
        iVar10 = (int)(char *)((long)dst + 1) + (int)pcVar9;
        goto LAB_0013cb08;
      }
    }
    else {
      if (0x7e000000 < (uint)srcSize) {
        return 0;
      }
      if (srcSize != 0) {
        *(int *)((long)state + 0x4018) = srcSize;
        *(uint *)((long)state + 0x4000) = srcSize + uVar22;
        *(undefined4 *)((long)state + 0x4004) = 3;
        piVar31 = (int *)src;
        if (0xc < (uint)srcSize) {
          lVar21 = (long)src - (ulong)uVar22;
          *(short *)((long)state + (ulong)((uint)(*(int *)src * -0x61c8864f) >> 0x13) * 2) =
               (short)uVar22;
          psVar8 = (short *)dst;
LAB_0013c122:
          uVar25 = 1;
          iVar10 = *(int *)((long)piVar31 + 1);
          piVar15 = (int *)((long)piVar31 + 1);
          uVar13 = acceleration << 6;
          while( true ) {
            piVar24 = (int *)(uVar25 + (long)piVar15);
            dst = (char *)psVar8;
            if (src + ((ulong)(uint)srcSize - 0xb) < piVar24) goto LAB_0013c3c7;
            uVar25 = (ulong)((uint)(iVar10 * -0x61c8864f) >> 0x13);
            uVar2 = *(ushort *)((long)state + uVar25 * 2);
            sVar3 = (short)lVar21;
            iVar10 = *piVar24;
            *(short *)((long)state + uVar25 * 2) = (short)piVar15 - sVar3;
            if ((uVar22 <= uVar2) && (*(int *)(lVar21 + (ulong)uVar2) == *piVar15)) break;
            uVar25 = (ulong)(uVar13 >> 6);
            uVar13 = uVar13 + 1;
            piVar15 = piVar24;
          }
          lVar7 = (ulong)uVar2 + lVar21;
          iVar10 = (int)piVar31;
          lVar23 = 0;
          cVar4 = (char)piVar15 * '\x10' + (char)piVar31 * -0x10;
          do {
            cVar18 = cVar4;
            lVar16 = lVar23;
            piVar24 = (int *)(lVar7 + lVar16);
            piVar30 = (int *)((long)piVar15 + lVar16);
            if ((piVar24 <= src) || (piVar30 <= piVar31)) break;
            lVar23 = lVar16 + -1;
            cVar4 = cVar18 + -0x10;
          } while (*(char *)((long)piVar15 + lVar16 + -1) == *(char *)(lVar7 + -1 + lVar16));
          if ((uint)(((int)piVar15 - iVar10) + (int)lVar16) < 0xf) {
            psVar34 = (short *)((long)psVar8 + 1);
            *(char *)psVar8 = cVar18;
          }
          else {
            *(char *)psVar8 = -0x10;
            psVar34 = psVar8 + 1;
            for (iVar14 = ((int)piVar15 - iVar10) + (int)lVar16 + -0xf; 0xfe < iVar14;
                iVar14 = iVar14 + -0xff) {
              *(char *)((long)psVar34 + -1) = -1;
              psVar34 = (short *)((long)psVar34 + 1);
            }
            *(char *)((long)psVar34 + -1) = (char)iVar14;
          }
          psVar27 = (short *)((ulong)(uint)((int)piVar30 - iVar10) + (long)psVar34);
          do {
            *(undefined8 *)psVar34 = *(undefined8 *)piVar31;
            psVar34 = psVar34 + 4;
            piVar31 = piVar31 + 2;
          } while (psVar34 < psVar27);
          do {
            *psVar27 = (short)piVar30 - (short)piVar24;
            dst = (char *)(psVar27 + 1);
            puVar1 = (ulong *)(piVar30 + 1);
            puVar12 = (ulong *)(piVar24 + 1);
            puVar20 = puVar1;
            if (puVar1 < src + ((ulong)(uint)srcSize - 0xc)) {
              if (*puVar12 == *puVar1) {
                puVar12 = (ulong *)(piVar24 + 3);
                puVar20 = (ulong *)(piVar30 + 3);
                goto LAB_0013c2ab;
              }
              uVar26 = *puVar1 ^ *puVar12;
              uVar25 = 0;
              if (uVar26 != 0) {
                for (; (uVar26 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                }
              }
              uVar25 = uVar25 >> 3 & 0x1fffffff;
              piVar31 = (int *)((long)piVar30 + uVar25 + 4);
LAB_0013c32b:
              *(char *)psVar8 = (char)*psVar8 + (char)uVar25;
            }
            else {
LAB_0013c2ab:
              if (puVar20 < src + ((ulong)(uint)srcSize - 0xc)) {
                if (*puVar12 == *puVar20) goto code_r0x0013c2bf;
                uVar26 = *puVar20 ^ *puVar12;
                uVar25 = 0;
                if (uVar26 != 0) {
                  for (; (uVar26 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                  }
                }
                puVar20 = (ulong *)((long)puVar20 + (uVar25 >> 3 & 0x1fffffff));
              }
              else {
                if ((puVar20 < src + ((ulong)(uint)srcSize - 8)) && ((int)*puVar12 == (int)*puVar20)
                   ) {
                  puVar20 = (ulong *)((long)puVar20 + 4);
                  puVar12 = (ulong *)((long)puVar12 + 4);
                }
                if ((puVar20 < src + ((ulong)(uint)srcSize - 6)) &&
                   ((short)*puVar12 == (short)*puVar20)) {
                  puVar20 = (ulong *)((long)puVar20 + 2);
                  puVar12 = (ulong *)((long)puVar12 + 2);
                }
                if (puVar20 < src + ((ulong)(uint)srcSize - 5)) {
                  puVar20 = (ulong *)((long)puVar20 + (ulong)((char)*puVar12 == (char)*puVar20));
                }
              }
              uVar25 = (long)puVar20 - (long)puVar1;
              piVar31 = (int *)((long)piVar30 + (uVar25 & 0xffffffff) + 4);
              if ((uint)uVar25 < 0xf) goto LAB_0013c32b;
              *(char *)psVar8 = (char)*psVar8 + '\x0f';
              *(short *)((long)dst + 0) = -1;
              *(short *)((long)dst + 2) = -1;
              lVar23 = 0;
              for (uVar13 = (uint)uVar25 - 0xf; 0x3fb < uVar13; uVar13 = uVar13 - 0x3fc) {
                pcVar9 = (char *)((long)psVar27 + lVar23 + 6);
                pcVar9[0] = -1;
                pcVar9[1] = -1;
                pcVar9[2] = -1;
                pcVar9[3] = -1;
                lVar23 = lVar23 + 4;
              }
              lVar7 = lVar23 + (ulong)(uVar13 & 0xffff) / 0xff;
              dst = (char *)((long)psVar27 + lVar7 + 3);
              *(char *)((long)psVar27 + lVar7 + 2) =
                   (char)lVar23 +
                   (char)((ushort)uVar13 / 0xff) + ((char)puVar20 - (char)piVar30) + -0x13;
            }
            if (src + ((ulong)(uint)srcSize - 0xb) <= piVar31) break;
            *(short *)((long)state +
                      (ulong)((uint)(*(int *)((long)piVar31 + -2) * -0x61c8864f) >> 0x13) * 2) =
                 ((short)piVar31 + -2) - sVar3;
            uVar25 = (ulong)((uint)(*piVar31 * -0x61c8864f) >> 0x13);
            uVar2 = *(ushort *)((long)state + uVar25 * 2);
            piVar24 = (int *)((ulong)uVar2 + lVar21);
            *(short *)((long)state + uVar25 * 2) = (short)piVar31 - sVar3;
            psVar8 = (short *)dst;
            if ((uVar2 < uVar22) || (*piVar24 != *piVar31)) goto LAB_0013c122;
            psVar27 = (short *)((long)dst + 1);
            *dst = '\0';
            piVar30 = piVar31;
          } while( true );
        }
LAB_0013c3c7:
        pcVar9 = src + ((ulong)(uint)srcSize - (long)piVar31);
        if (pcVar9 < (char *)0xf) {
          *dst = (char)pcVar9 << 4;
        }
        else {
          *dst = -0x10;
          for (pcVar32 = pcVar9 + -0xf; dst = (char *)((long)dst + 1), (char *)0xfe < pcVar32;
              pcVar32 = pcVar32 + -0xff) {
            *dst = -1;
          }
          *dst = (char)pcVar32;
        }
        memcpy((char *)((long)dst + 1),piVar31,(size_t)pcVar9);
        iVar10 = (int)(char *)((long)dst + 1) + (int)pcVar9;
LAB_0013cb08:
        return iVar10 - local_60;
      }
    }
    *dst = '\0';
    return 1;
  }
  if (0x1000a < srcSize) {
    if (iVar14 == 0) {
      if (*(int *)((long)state + 0x4000) == 0) {
        uVar22 = 0;
      }
      else {
        uVar22 = *(int *)((long)state + 0x4000) + 0x10000;
        *(uint *)((long)state + 0x4000) = uVar22;
      }
    }
    else {
      uVar22 = 0;
      memset(state,0,0x4008);
    }
    *(undefined4 *)((long)state + 0x4018) = 0;
    *(undefined8 *)((long)state + 0x4008) = 0;
    *(undefined8 *)((long)state + 0x4010) = 0;
    if (0x7e000000 < (uint)srcSize) {
      return 0;
    }
    lVar21 = (long)src - (ulong)uVar22;
    pcVar9 = dst + dstCapacity;
    *(int *)((long)state + 0x4018) = srcSize;
    *(uint *)((long)state + 0x4000) = srcSize + uVar22;
    *(undefined4 *)((long)state + 0x4004) = 2;
    *(uint *)((long)state + ((ulong)(*(long *)src * -0x30e4432345000000) >> 0x34) * 4) = uVar22;
    plVar29 = (long *)src;
    local_88 = (short *)dst;
LAB_0013b600:
    uVar25 = 1;
    lVar23 = *(long *)((long)plVar29 + 1);
    plVar5 = (long *)((long)plVar29 + 1);
    uVar22 = acceleration << 6;
    while( true ) {
      plVar28 = (long *)(uVar25 + (long)plVar5);
      if (src + ((ulong)(uint)srcSize - 0xb) < plVar28) goto LAB_0013b924;
      uVar25 = (ulong)(lVar23 * -0x30e4432345000000) >> 0x34;
      uVar13 = *(uint *)((long)state + uVar25 * 4);
      iVar10 = (int)plVar5;
      iVar14 = (int)lVar21;
      lVar23 = *plVar28;
      *(int *)((long)state + uVar25 * 4) = iVar10 - iVar14;
      if (((uint)(iVar10 - iVar14) <= uVar13 + 0xffff) &&
         (*(int *)(lVar21 + (ulong)uVar13) == (int)*plVar5)) break;
      uVar25 = (ulong)(uVar22 >> 6);
      uVar22 = uVar22 + 1;
      plVar5 = plVar28;
    }
    lVar7 = (ulong)uVar13 + lVar21;
    lVar23 = 0;
    cVar4 = (char)plVar5 * '\x10' + (char)plVar29 * -0x10;
    do {
      cVar18 = cVar4;
      lVar16 = lVar23;
      piVar31 = (int *)(lVar7 + lVar16);
      plVar28 = (long *)((long)plVar5 + lVar16);
      if ((piVar31 <= src) || (plVar28 <= plVar29)) break;
      lVar23 = lVar16 + -1;
      cVar4 = cVar18 + -0x10;
    } while (*(char *)((long)plVar5 + lVar16 + -1) == *(char *)(lVar7 + -1 + lVar16));
    uVar22 = iVar10 - (int)plVar29;
    uVar26 = (ulong)(uVar22 + (int)lVar16);
    uVar25 = (ulong)uVar22 + lVar16;
    if (pcVar9 < (char *)((long)local_88 + (uVar25 & 0xffffffff) / 0xff + uVar26 + 9)) {
      return 0;
    }
    if ((uint)uVar25 < 0xf) {
      plVar5 = (long *)((long)local_88 + 1);
      *(char *)local_88 = cVar18;
    }
    else {
      *(char *)local_88 = -0x10;
      plVar5 = (long *)((long)local_88 + 2);
      for (iVar10 = (iVar10 - (int)plVar29) + (int)lVar16 + -0xf; 0xfe < iVar10;
          iVar10 = iVar10 + -0xff) {
        *(char *)((long)plVar5 + -1) = -1;
        plVar5 = (long *)((long)plVar5 + 1);
      }
      *(char *)((long)plVar5 + -1) = (char)iVar10;
    }
    plVar33 = (long *)(uVar26 + (long)plVar5);
    do {
      *plVar5 = *plVar29;
      plVar5 = plVar5 + 1;
      plVar29 = plVar29 + 1;
      psVar8 = local_88;
    } while (plVar5 < plVar33);
    do {
      *(short *)plVar33 = (short)plVar28 - (short)piVar31;
      puVar1 = (ulong *)((long)plVar28 + 4);
      puVar12 = (ulong *)(piVar31 + 1);
      puVar20 = puVar1;
      if (src + ((ulong)(uint)srcSize - 0xc) <= puVar1) {
LAB_0013b7c5:
        iVar10 = ((int)puVar20 - (int)plVar28) + -4;
LAB_0013b7cd:
        if (puVar20 < src + ((ulong)(uint)srcSize - 0xc)) {
          if (*puVar12 == *puVar20) goto code_r0x0013b7e1;
          uVar26 = *puVar20 ^ *puVar12;
          uVar25 = 0;
          if (uVar26 != 0) {
            for (; (uVar26 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
            }
          }
          uVar22 = ((uint)(uVar25 >> 3) & 0x1fffffff) + iVar10;
        }
        else {
          if ((puVar20 < src + ((ulong)(uint)srcSize - 8)) && ((int)*puVar12 == (int)*puVar20)) {
            puVar20 = (ulong *)((long)puVar20 + 4);
            puVar12 = (ulong *)((long)puVar12 + 4);
          }
          if ((puVar20 < src + ((ulong)(uint)srcSize - 6)) && ((short)*puVar12 == (short)*puVar20))
          {
            puVar20 = (ulong *)((long)puVar20 + 2);
            puVar12 = (ulong *)((long)puVar12 + 2);
          }
          if (puVar20 < src + ((ulong)(uint)srcSize - 5)) {
            puVar20 = (ulong *)((long)puVar20 + (ulong)((char)*puVar12 == (char)*puVar20));
          }
          uVar22 = (int)puVar20 - (int)puVar1;
        }
        goto LAB_0013b80c;
      }
      if (*puVar12 == *puVar1) {
        puVar12 = (ulong *)(piVar31 + 3);
        puVar20 = (ulong *)((long)plVar28 + 0xc);
        goto LAB_0013b7c5;
      }
      uVar25 = *puVar1 ^ *puVar12;
      lVar23 = 0;
      if (uVar25 != 0) {
        for (; (uVar25 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
        }
      }
      uVar22 = (uint)lVar23 >> 3;
LAB_0013b80c:
      if (pcVar9 < (char *)((long)plVar33 + (ulong)(uVar22 + 0xf0) / 0xff + 8)) {
        return 0;
      }
      local_88 = (short *)((long)plVar33 + 2);
      if (uVar22 < 0xf) {
        *(char *)psVar8 = *(char *)psVar8 + (char)uVar22;
      }
      else {
        *(char *)psVar8 = *(char *)psVar8 + '\x0f';
        *(char *)((long)local_88 + 0) = -1;
        *(char *)((long)local_88 + 1) = -1;
        *(char *)((long)local_88 + 2) = -1;
        *(char *)((long)local_88 + 3) = -1;
        lVar23 = 0;
        for (uVar13 = uVar22 - 0xf; 0x3fb < uVar13; uVar13 = uVar13 - 0x3fc) {
          pcVar32 = (char *)((long)plVar33 + lVar23 + 6);
          pcVar32[0] = -1;
          pcVar32[1] = -1;
          pcVar32[2] = -1;
          pcVar32[3] = -1;
          lVar23 = lVar23 + 4;
        }
        lVar7 = lVar23 + ((ulong)uVar13 & 0xffff) / 0xff;
        local_88 = (short *)((long)plVar33 + lVar7 + 3);
        *(char *)((long)plVar33 + lVar7 + 2) =
             (char)lVar23 + (char)((uVar13 & 0xffff) / 0xff) + (char)uVar22 + -0xf;
      }
      lVar23 = (long)plVar28 + (ulong)uVar22;
      plVar29 = (long *)(lVar23 + 4);
      if (src + ((ulong)(uint)srcSize - 0xb) <= plVar29) goto LAB_0013b924;
      *(int *)((long)state + ((ulong)(*(long *)(lVar23 + 2) * -0x30e4432345000000) >> 0x34) * 4) =
           ((int)lVar23 + 2) - iVar14;
      uVar25 = (ulong)(*plVar29 * -0x30e4432345000000) >> 0x34;
      uVar13 = (int)plVar29 - iVar14;
      uVar22 = *(uint *)((long)state + uVar25 * 4);
      piVar31 = (int *)((ulong)uVar22 + lVar21);
      *(uint *)((long)state + uVar25 * 4) = uVar13;
      if ((uVar22 + 0xffff < uVar13) || (*piVar31 != *(int *)plVar29)) goto LAB_0013b600;
      plVar33 = (long *)((long)local_88 + 1);
      *(char *)local_88 = '\0';
      plVar28 = plVar29;
      psVar8 = local_88;
    } while( true );
  }
  if (iVar14 == 3) {
    uVar22 = *(uint *)((long)state + 0x4000);
    if (0xfff < srcSize || 0xfffe < srcSize + uVar22) goto LAB_0013b382;
  }
  else if (iVar14 == 0) {
    uVar22 = *(uint *)((long)state + 0x4000);
  }
  else {
LAB_0013b382:
    uVar22 = 0;
    memset(state,0,0x4008);
  }
  *(undefined4 *)((long)state + 0x4018) = 0;
  *(undefined8 *)((long)state + 0x4008) = 0;
  *(undefined8 *)((long)state + 0x4010) = 0;
  if (uVar22 == 0) {
    if (0x7e000000 < (uint)srcSize) {
      return 0;
    }
    if (srcSize != 0) {
      pcVar9 = dst + dstCapacity;
      *(int *)((long)state + 0x4018) = srcSize;
      *(int *)((long)state + 0x4000) = srcSize;
      *(undefined4 *)((long)state + 0x4004) = 3;
      piVar31 = (int *)src;
      if ((uint)srcSize < 0xd) {
LAB_0013cb1d:
        pcVar32 = src + ((ulong)(uint)srcSize - (long)piVar31);
        if ((char *)((long)dst + (long)(pcVar32 + (ulong)(pcVar32 + 0xf0) / 0xff + 1)) <= pcVar9) {
          if (pcVar32 < (char *)0xf) {
            *dst = (char)pcVar32 << 4;
          }
          else {
            *dst = -0x10;
            for (pcVar9 = pcVar32 + -0xf; dst = (char *)((long)dst + 1), (char *)0xfe < pcVar9;
                pcVar9 = pcVar9 + -0xff) {
              *dst = -1;
            }
            *dst = (char)pcVar9;
          }
          memcpy((char *)((long)dst + 1),piVar31,(size_t)pcVar32);
          return ((int)(char *)((long)dst + 1) + (int)pcVar32) - local_60;
        }
        return 0;
      }
      *(undefined2 *)((long)state + (ulong)((uint)(*(int *)src * -0x61c8864f) >> 0x13) * 2) = 0;
LAB_0013c4d0:
      uVar25 = 1;
      iVar10 = *(int *)((long)piVar31 + 1);
      piVar15 = (int *)((long)piVar31 + 1);
      uVar22 = acceleration << 6;
      do {
        piVar24 = piVar15;
        piVar15 = (int *)(uVar25 + (long)piVar24);
        if (src + ((ulong)(uint)srcSize - 0xb) < piVar15) goto LAB_0013cb1d;
        uVar25 = (ulong)(uVar22 >> 6);
        uVar22 = uVar22 + 1;
        uVar17 = (ulong)((uint)(iVar10 * -0x61c8864f) >> 0x13);
        uVar26 = (ulong)*(ushort *)((long)state + uVar17 * 2);
        iVar10 = *piVar15;
        *(short *)((long)state + uVar17 * 2) = (short)piVar24 - sVar3;
      } while (*(int *)(src + uVar26) != *piVar24);
      lVar21 = 0;
      cVar4 = (char)piVar24 * '\x10' + (char)piVar31 * -0x10;
      do {
        cVar18 = cVar4;
        lVar23 = lVar21;
        pcVar32 = src + lVar23 + uVar26;
        piVar15 = (int *)((long)piVar24 + lVar23);
        if ((pcVar32 <= src) || (piVar15 <= piVar31)) break;
        lVar21 = lVar23 + -1;
        cVar4 = cVar18 + -0x10;
      } while (*(char *)((long)piVar24 + lVar23 + -1) == src[lVar23 + (uVar26 - 1)]);
      uVar22 = (int)piVar24 - (int)piVar31;
      uVar25 = (ulong)(uVar22 + (int)lVar23);
      uVar26 = (ulong)uVar22 + lVar23;
      if (pcVar9 < (char *)((long)dst + (uVar26 & 0xffffffff) / 0xff + uVar25 + 9)) {
        return 0;
      }
      if ((uint)uVar26 < 0xf) {
        psVar8 = (short *)((long)dst + 1);
        *dst = cVar18;
      }
      else {
        *dst = -0x10;
        psVar8 = (short *)((long)dst + 2);
        for (iVar10 = ((int)piVar24 - (int)piVar31) + (int)lVar23 + -0xf; 0xfe < iVar10;
            iVar10 = iVar10 + -0xff) {
          *(char *)((long)psVar8 + -1) = -1;
          psVar8 = (short *)((long)psVar8 + 1);
        }
        *(char *)((long)psVar8 + -1) = (char)iVar10;
      }
      psVar34 = (short *)(uVar25 + (long)psVar8);
      do {
        *(undefined8 *)psVar8 = *(undefined8 *)piVar31;
        psVar8 = psVar8 + 4;
        piVar31 = piVar31 + 2;
        psVar27 = (short *)dst;
      } while (psVar8 < psVar34);
      do {
        *psVar34 = (short)piVar15 - (short)pcVar32;
        puVar1 = (ulong *)(piVar15 + 1);
        puVar12 = (ulong *)(pcVar32 + 4);
        puVar20 = puVar1;
        if (src + ((ulong)(uint)srcSize - 0xc) <= puVar1) {
LAB_0013c676:
          iVar10 = ((int)puVar20 - (int)piVar15) + -4;
LAB_0013c67d:
          if (puVar20 < src + ((ulong)(uint)srcSize - 0xc)) {
            if (*puVar12 == *puVar20) goto code_r0x0013c68d;
            uVar26 = *puVar20 ^ *puVar12;
            uVar25 = 0;
            if (uVar26 != 0) {
              for (; (uVar26 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
              }
            }
            uVar22 = ((uint)(uVar25 >> 3) & 0x1fffffff) + iVar10;
          }
          else {
            if ((puVar20 < src + ((ulong)(uint)srcSize - 8)) && ((int)*puVar12 == (int)*puVar20)) {
              puVar20 = (ulong *)((long)puVar20 + 4);
              puVar12 = (ulong *)((long)puVar12 + 4);
            }
            if ((puVar20 < src + ((ulong)(uint)srcSize - 6)) && ((short)*puVar12 == (short)*puVar20)
               ) {
              puVar20 = (ulong *)((long)puVar20 + 2);
              puVar12 = (ulong *)((long)puVar12 + 2);
            }
            if (puVar20 < src + ((ulong)(uint)srcSize - 5)) {
              puVar20 = (ulong *)((long)puVar20 + (ulong)((char)*puVar12 == (char)*puVar20));
            }
            uVar22 = (int)puVar20 - (int)puVar1;
          }
          goto LAB_0013c6b2;
        }
        if (*puVar12 == *puVar1) {
          puVar12 = (ulong *)(pcVar32 + 0xc);
          puVar20 = (ulong *)(piVar15 + 3);
          goto LAB_0013c676;
        }
        uVar25 = *puVar1 ^ *puVar12;
        lVar21 = 0;
        if (uVar25 != 0) {
          for (; (uVar25 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
          }
        }
        uVar22 = (uint)lVar21 >> 3;
LAB_0013c6b2:
        if (pcVar9 < (char *)((long)psVar34 + (ulong)(uVar22 + 0xf0) / 0xff + 8)) {
          return 0;
        }
        dst = (char *)(psVar34 + 1);
        if (uVar22 < 0xf) {
          *(char *)psVar27 = (char)*psVar27 + (char)uVar22;
        }
        else {
          *(char *)psVar27 = (char)*psVar27 + '\x0f';
          *(short *)((long)dst + 0) = -1;
          *(short *)((long)dst + 2) = -1;
          lVar21 = 0;
          for (uVar13 = uVar22 - 0xf; 0x3fb < uVar13; uVar13 = uVar13 - 0x3fc) {
            pcVar32 = (char *)((long)psVar34 + lVar21 + 6);
            pcVar32[0] = -1;
            pcVar32[1] = -1;
            pcVar32[2] = -1;
            pcVar32[3] = -1;
            lVar21 = lVar21 + 4;
          }
          lVar23 = lVar21 + ((ulong)uVar13 & 0xffff) / 0xff;
          dst = (char *)((long)psVar34 + lVar23 + 3);
          *(char *)((long)psVar34 + lVar23 + 2) =
               (char)lVar21 + (char)((uVar13 & 0xffff) / 0xff) + (char)uVar22 + -0xf;
        }
        lVar21 = (long)piVar15 + (ulong)uVar22;
        piVar15 = (int *)(lVar21 + 4);
        piVar31 = piVar15;
        if (src + ((ulong)(uint)srcSize - 0xb) <= piVar15) goto LAB_0013cb1d;
        *(short *)((long)state + (ulong)((uint)(*(int *)(lVar21 + 2) * -0x61c8864f) >> 0x13) * 2) =
             ((short)lVar21 + 2) - sVar3;
        uVar25 = (ulong)((uint)(*piVar15 * -0x61c8864f) >> 0x13);
        uVar2 = *(ushort *)((long)state + uVar25 * 2);
        pcVar32 = src + uVar2;
        *(short *)((long)state + uVar25 * 2) = (short)piVar15 - sVar3;
        if (*(int *)(src + uVar2) != *piVar15) goto LAB_0013c4d0;
        psVar34 = (short *)((long)dst + 1);
        *dst = '\0';
        psVar27 = (short *)dst;
      } while( true );
    }
  }
  else {
    if (0x7e000000 < (uint)srcSize) {
      return 0;
    }
    if (srcSize != 0) {
      pcVar9 = dst + dstCapacity;
      *(int *)((long)state + 0x4018) = srcSize;
      *(uint *)((long)state + 0x4000) = srcSize + uVar22;
      *(undefined4 *)((long)state + 0x4004) = 3;
      piVar31 = (int *)src;
      if (0xc < (uint)srcSize) {
        lVar21 = (long)src - (ulong)uVar22;
        *(short *)((long)state + (ulong)((uint)(*(int *)src * -0x61c8864f) >> 0x13) * 2) =
             (short)uVar22;
LAB_0013bdba:
        uVar25 = 1;
        iVar10 = *(int *)((long)piVar31 + 1);
        piVar15 = (int *)((long)piVar31 + 1);
        uVar13 = acceleration << 6;
        while( true ) {
          piVar24 = (int *)(uVar25 + (long)piVar15);
          if (src + ((ulong)(uint)srcSize - 0xb) < piVar24) goto LAB_0013c418;
          uVar25 = (ulong)((uint)(iVar10 * -0x61c8864f) >> 0x13);
          uVar2 = *(ushort *)((long)state + uVar25 * 2);
          sVar3 = (short)lVar21;
          iVar10 = *piVar24;
          *(short *)((long)state + uVar25 * 2) = (short)piVar15 - sVar3;
          if ((uVar22 <= uVar2) && (*(int *)(lVar21 + (ulong)uVar2) == *piVar15)) break;
          uVar25 = (ulong)(uVar13 >> 6);
          uVar13 = uVar13 + 1;
          piVar15 = piVar24;
        }
        lVar7 = (ulong)uVar2 + lVar21;
        lVar23 = 0;
        cVar4 = (char)piVar15 * '\x10' + (char)piVar31 * -0x10;
        do {
          cVar18 = cVar4;
          lVar16 = lVar23;
          piVar24 = (int *)(lVar7 + lVar16);
          piVar30 = (int *)((long)piVar15 + lVar16);
          if ((piVar24 <= src) || (piVar30 <= piVar31)) break;
          lVar23 = lVar16 + -1;
          cVar4 = cVar18 + -0x10;
        } while (*(char *)((long)piVar15 + lVar16 + -1) == *(char *)(lVar7 + -1 + lVar16));
        uVar13 = (int)piVar15 - (int)piVar31;
        uVar26 = (ulong)(uVar13 + (int)lVar16);
        uVar25 = (ulong)uVar13 + lVar16;
        if (pcVar9 < (char *)((long)dst + (uVar25 & 0xffffffff) / 0xff + uVar26 + 9)) {
          return 0;
        }
        if ((uint)uVar25 < 0xf) {
          psVar8 = (short *)((long)dst + 1);
          *dst = cVar18;
        }
        else {
          *dst = -0x10;
          psVar8 = (short *)((long)dst + 2);
          for (iVar10 = ((int)piVar15 - (int)piVar31) + (int)lVar16 + -0xf; 0xfe < iVar10;
              iVar10 = iVar10 + -0xff) {
            *(char *)((long)psVar8 + -1) = -1;
            psVar8 = (short *)((long)psVar8 + 1);
          }
          *(char *)((long)psVar8 + -1) = (char)iVar10;
        }
        psVar34 = (short *)(uVar26 + (long)psVar8);
        do {
          *(undefined8 *)psVar8 = *(undefined8 *)piVar31;
          psVar8 = psVar8 + 4;
          piVar31 = piVar31 + 2;
          local_88 = (short *)dst;
        } while (psVar8 < psVar34);
        do {
          *psVar34 = (short)piVar30 - (short)piVar24;
          puVar1 = (ulong *)(piVar30 + 1);
          puVar12 = (ulong *)(piVar24 + 1);
          puVar20 = puVar1;
          if (src + ((ulong)(uint)srcSize - 0xc) <= puVar1) {
LAB_0013bf75:
            iVar10 = ((int)puVar20 - (int)piVar30) + -4;
LAB_0013bf7d:
            if (puVar20 < src + ((ulong)(uint)srcSize - 0xc)) {
              if (*puVar12 == *puVar20) goto code_r0x0013bf91;
              uVar26 = *puVar20 ^ *puVar12;
              uVar25 = 0;
              if (uVar26 != 0) {
                for (; (uVar26 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                }
              }
              uVar13 = ((uint)(uVar25 >> 3) & 0x1fffffff) + iVar10;
            }
            else {
              if ((puVar20 < src + ((ulong)(uint)srcSize - 8)) && ((int)*puVar12 == (int)*puVar20))
              {
                puVar20 = (ulong *)((long)puVar20 + 4);
                puVar12 = (ulong *)((long)puVar12 + 4);
              }
              if ((puVar20 < src + ((ulong)(uint)srcSize - 6)) &&
                 ((short)*puVar12 == (short)*puVar20)) {
                puVar20 = (ulong *)((long)puVar20 + 2);
                puVar12 = (ulong *)((long)puVar12 + 2);
              }
              if (puVar20 < src + ((ulong)(uint)srcSize - 5)) {
                puVar20 = (ulong *)((long)puVar20 + (ulong)((char)*puVar12 == (char)*puVar20));
              }
              uVar13 = (int)puVar20 - (int)puVar1;
            }
            goto LAB_0013bfb6;
          }
          if (*puVar12 == *puVar1) {
            puVar12 = (ulong *)(piVar24 + 3);
            puVar20 = (ulong *)(piVar30 + 3);
            goto LAB_0013bf75;
          }
          uVar25 = *puVar1 ^ *puVar12;
          lVar23 = 0;
          if (uVar25 != 0) {
            for (; (uVar25 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
            }
          }
          uVar13 = (uint)lVar23 >> 3;
LAB_0013bfb6:
          if (pcVar9 < (char *)((long)psVar34 + (ulong)(uVar13 + 0xf0) / 0xff + 8)) {
            return 0;
          }
          dst = (char *)(psVar34 + 1);
          if (uVar13 < 0xf) {
            *(char *)local_88 = (char)*local_88 + (char)uVar13;
          }
          else {
            *(char *)local_88 = (char)*local_88 + '\x0f';
            *(short *)((long)dst + 0) = -1;
            *(short *)((long)dst + 2) = -1;
            lVar23 = 0;
            for (uVar11 = uVar13 - 0xf; 0x3fb < uVar11; uVar11 = uVar11 - 0x3fc) {
              pcVar32 = (char *)((long)psVar34 + lVar23 + 6);
              pcVar32[0] = -1;
              pcVar32[1] = -1;
              pcVar32[2] = -1;
              pcVar32[3] = -1;
              lVar23 = lVar23 + 4;
            }
            lVar7 = lVar23 + ((ulong)uVar11 & 0xffff) / 0xff;
            dst = (char *)((long)psVar34 + lVar7 + 3);
            *(char *)((long)psVar34 + lVar7 + 2) =
                 (char)lVar23 + (char)((uVar11 & 0xffff) / 0xff) + (char)uVar13 + -0xf;
          }
          lVar23 = (long)piVar30 + (ulong)uVar13;
          piVar31 = (int *)(lVar23 + 4);
          if (src + ((ulong)(uint)srcSize - 0xb) <= piVar31) break;
          *(short *)((long)state + (ulong)((uint)(*(int *)(lVar23 + 2) * -0x61c8864f) >> 0x13) * 2)
               = ((short)lVar23 + 2) - sVar3;
          uVar25 = (ulong)((uint)(*piVar31 * -0x61c8864f) >> 0x13);
          uVar2 = *(ushort *)((long)state + uVar25 * 2);
          piVar24 = (int *)((ulong)uVar2 + lVar21);
          *(short *)((long)state + uVar25 * 2) = (short)piVar31 - sVar3;
          if ((uVar2 < uVar22) || (*piVar24 != *piVar31)) goto LAB_0013bdba;
          psVar34 = (short *)((long)dst + 1);
          *dst = '\0';
          piVar30 = piVar31;
          local_88 = (short *)dst;
        } while( true );
      }
LAB_0013c418:
      pcVar32 = src + ((ulong)(uint)srcSize - (long)piVar31);
      if (pcVar9 < (char *)((long)dst + (long)(pcVar32 + (ulong)(pcVar32 + 0xf0) / 0xff + 1))) {
        return 0;
      }
      if (pcVar32 < (char *)0xf) {
        *dst = (char)pcVar32 << 4;
      }
      else {
        *dst = -0x10;
        for (pcVar9 = pcVar32 + -0xf; dst = (char *)((long)dst + 1), (char *)0xfe < pcVar9;
            pcVar9 = pcVar9 + -0xff) {
          *dst = -1;
        }
        *dst = (char)pcVar9;
      }
      memcpy((char *)((long)dst + 1),piVar31,(size_t)pcVar32);
      iVar10 = (int)(char *)((long)dst + 1) + (int)pcVar32;
LAB_0013cb91:
      return iVar10 - local_60;
    }
  }
  if (0 < dstCapacity) {
    *dst = '\0';
    return 1;
  }
  return 0;
code_r0x0013bbdc:
  puVar12 = puVar12 + 1;
  puVar20 = puVar20 + 1;
  goto LAB_0013bbcc;
LAB_0013bce7:
  pcVar32 = src + ((ulong)(uint)srcSize - (long)plVar29);
  if (pcVar32 < (char *)0xf) {
    *pcVar9 = (char)pcVar32 << 4;
  }
  else {
    *pcVar9 = -0x10;
    for (pcVar6 = pcVar32 + -0xf; pcVar9 = pcVar9 + 1, (char *)0xfe < pcVar6;
        pcVar6 = pcVar6 + -0xff) {
      *pcVar9 = -1;
    }
    *pcVar9 = (char)pcVar6;
  }
  memcpy(pcVar9 + 1,plVar29,(size_t)pcVar32);
  iVar10 = (int)(pcVar9 + 1) + (int)pcVar32;
  goto LAB_0013cb08;
code_r0x0013c9c3:
  puVar12 = puVar12 + 1;
  puVar20 = puVar20 + 1;
  goto LAB_0013c9af;
code_r0x0013c2bf:
  puVar12 = puVar12 + 1;
  puVar20 = puVar20 + 1;
  goto LAB_0013c2ab;
code_r0x0013b7e1:
  puVar20 = puVar20 + 1;
  puVar12 = puVar12 + 1;
  iVar10 = iVar10 + 8;
  goto LAB_0013b7cd;
LAB_0013b924:
  pcVar32 = src + ((ulong)(uint)srcSize - (long)plVar29);
  if (pcVar9 < (char *)((long)local_88 + (long)(pcVar32 + (ulong)(pcVar32 + 0xf0) / 0xff + 1))) {
    return 0;
  }
  if (pcVar32 < (char *)0xf) {
    *(char *)local_88 = (char)pcVar32 << 4;
  }
  else {
    *(char *)local_88 = -0x10;
    for (pcVar9 = pcVar32 + -0xf; local_88 = (short *)((long)local_88 + 1), (char *)0xfe < pcVar9;
        pcVar9 = pcVar9 + -0xff) {
      *(char *)local_88 = -1;
    }
    *(char *)local_88 = (char)pcVar9;
  }
  memcpy((char *)((long)local_88 + 1),plVar29,(size_t)pcVar32);
  iVar10 = (int)(char *)((long)local_88 + 1) + (int)pcVar32;
  goto LAB_0013cb91;
code_r0x0013c68d:
  puVar20 = puVar20 + 1;
  puVar12 = puVar12 + 1;
  iVar10 = iVar10 + 8;
  goto LAB_0013c67d;
code_r0x0013bf91:
  puVar20 = puVar20 + 1;
  puVar12 = puVar12 + 1;
  iVar10 = iVar10 + 8;
  goto LAB_0013bf7d;
}

Assistant:

int LZ4_compress_fast_extState_fastReset(void* state, const char* src, char* dst, int srcSize, int dstCapacity, int acceleration)
{
    LZ4_stream_t_internal* ctx = &((LZ4_stream_t*)state)->internal_donotuse;
    if (acceleration < 1) acceleration = LZ4_ACCELERATION_DEFAULT;
    if (acceleration > LZ4_ACCELERATION_MAX) acceleration = LZ4_ACCELERATION_MAX;

    if (dstCapacity >= LZ4_compressBound(srcSize)) {
        if (srcSize < LZ4_64Klimit) {
            const tableType_t tableType = byU16;
            LZ4_prepareTable(ctx, srcSize, tableType);
            if (ctx->currentOffset) {
                return LZ4_compress_generic(ctx, src, dst, srcSize, NULL, 0, notLimited, tableType, noDict, dictSmall, acceleration);
            } else {
                return LZ4_compress_generic(ctx, src, dst, srcSize, NULL, 0, notLimited, tableType, noDict, noDictIssue, acceleration);
            }
        } else {
            const tableType_t tableType = ((sizeof(void*)==4) && ((uptrval)src > LZ4_DISTANCE_MAX)) ? byPtr : byU32;
            LZ4_prepareTable(ctx, srcSize, tableType);
            return LZ4_compress_generic(ctx, src, dst, srcSize, NULL, 0, notLimited, tableType, noDict, noDictIssue, acceleration);
        }
    } else {
        if (srcSize < LZ4_64Klimit) {
            const tableType_t tableType = byU16;
            LZ4_prepareTable(ctx, srcSize, tableType);
            if (ctx->currentOffset) {
                return LZ4_compress_generic(ctx, src, dst, srcSize, NULL, dstCapacity, limitedOutput, tableType, noDict, dictSmall, acceleration);
            } else {
                return LZ4_compress_generic(ctx, src, dst, srcSize, NULL, dstCapacity, limitedOutput, tableType, noDict, noDictIssue, acceleration);
            }
        } else {
            const tableType_t tableType = ((sizeof(void*)==4) && ((uptrval)src > LZ4_DISTANCE_MAX)) ? byPtr : byU32;
            LZ4_prepareTable(ctx, srcSize, tableType);
            return LZ4_compress_generic(ctx, src, dst, srcSize, NULL, dstCapacity, limitedOutput, tableType, noDict, noDictIssue, acceleration);
        }
    }
}